

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

bool __thiscall
deqp::gls::UniformBlockCase::compareSharedBlocks
          (UniformBlockCase *this,UniformLayout *refLayout,UniformLayout *cmpLayout)

{
  pointer pUVar1;
  UniformBlock *pUVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pUVar5;
  UniformLayout *this_00;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  int *piVar10;
  char *pcVar11;
  size_t sVar12;
  long *plVar13;
  int *piVar14;
  bool bVar15;
  string instanceName;
  allocator<char> local_209;
  TestLog *local_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  vector<int,_std::allocator<int>_> *local_1e0;
  UniformLayout *local_1d8;
  ulong local_1d0;
  UniformBlockCase *local_1c8;
  UniformLayout *local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  uVar8 = (uint)((ulong)((long)(this->m_interface).m_uniformBlocks.
                               super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_interface).m_uniformBlocks.
                              super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar8 < 1) {
    bVar15 = true;
  }
  else {
    local_208 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    local_1d0 = (ulong)(uVar8 & 0x7fffffff);
    bVar15 = true;
    local_1b8 = 0;
    local_1d8 = refLayout;
    local_1c8 = this;
    local_1c0 = cmpLayout;
    do {
      pUVar2 = (local_1c8->m_interface).m_uniformBlocks.
               super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_1b8];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,(pUVar2->m_blockName)._M_dataplus._M_p,&local_209);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_1b0);
      this_00 = local_1c0;
      local_200 = &local_1f0;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_1f0 = *plVar13;
        lStack_1e8 = plVar9[3];
      }
      else {
        local_1f0 = *plVar13;
        local_200 = (long *)*plVar9;
      }
      local_1f8 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      iVar6 = ub::UniformLayout::getBlockIndex(local_1d8,(char *)local_200);
      uVar7 = ub::UniformLayout::getBlockIndex(this_00,(char *)local_200);
      uVar8 = pUVar2->m_flags;
      if ((uVar8 & 8) != 0) {
        if ((int)uVar7 < 0) {
          if ((uVar8 & 0x300) != 0) {
            local_1b0 = (undefined1  [8])local_208;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Error: Uniform block \'",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)local_200,local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"\' not found",0xb);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar15 = false;
          }
        }
        else {
          pBVar3 = (local_1d8->blocks).
                   super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar4 = (this_00->blocks).
                   super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1e0 = &pBVar3[iVar6].activeUniformIndices;
          piVar14 = *(int **)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
          piVar10 = *(pointer *)
                     ((long)&pBVar3[iVar6].activeUniformIndices.
                             super__Vector_base<int,_std::allocator<int>_> + 8);
          if ((long)piVar10 - (long)piVar14 !=
              (long)*(pointer *)
                     ((long)&pBVar4[uVar7].activeUniformIndices.
                             super__Vector_base<int,_std::allocator<int>_> + 8) -
              *(long *)&pBVar4[uVar7].activeUniformIndices.
                        super__Vector_base<int,_std::allocator<int>_>) {
            local_1b0 = (undefined1  [8])local_208;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Error: Number of active uniforms differ in block \'",
                       0x32);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)local_200,local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"\' (expected ",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            piVar14 = *(int **)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
            piVar10 = *(pointer *)
                       ((long)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                       8);
            bVar15 = false;
          }
          if (piVar14 != piVar10) {
            do {
              pUVar5 = (local_1d8->uniforms).
                       super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pUVar1 = pUVar5 + *piVar14;
              uVar8 = ub::UniformLayout::getUniformIndex
                                (this_00,pUVar5[*piVar14].name._M_dataplus._M_p);
              if ((int)uVar8 < 0) {
                local_1b0 = (undefined1  [8])local_208;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"Error: Uniform \'",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,(pUVar1->name)._M_dataplus._M_p,
                           (pUVar1->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"\' not found",0xb);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
LAB_018498dd:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                std::ios_base::~ios_base(local_138);
                bVar15 = false;
              }
              else {
                pUVar5 = (this_00->uniforms).
                         super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((pUVar1->type != pUVar5[uVar8].type) || (pUVar1->size != pUVar5[uVar8].size))
                   || (pUVar1->isRowMajor != pUVar5[uVar8].isRowMajor)) {
                  local_1b0 = (undefined1  [8])local_208;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,"Error: Layout mismatch in \'",0x1b);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,(pUVar1->name)._M_dataplus._M_p,
                             (pUVar1->name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,"\':\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,"  expected: type = ",0x13);
                  pcVar11 = glu::getDataTypeName(pUVar1->type);
                  iVar6 = (int)(ostringstream *)&local_1a8;
                  if (pcVar11 == (char *)0x0) {
                    std::ios::clear(iVar6 + (int)local_1a8[-3]);
                  }
                  else {
                    sVar12 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_1a8,pcVar11,sVar12);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,", size = ",9);
                  std::ostream::operator<<((ostringstream *)&local_1a8,pUVar1->size);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,", row major = ",0xe);
                  pcVar11 = "false";
                  if ((ulong)pUVar1->isRowMajor != 0) {
                    pcVar11 = "true";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,pcVar11,(ulong)pUVar1->isRowMajor ^ 5);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,"  got: type = ",0xe);
                  pcVar11 = glu::getDataTypeName(pUVar5[uVar8].type);
                  if (pcVar11 == (char *)0x0) {
                    std::ios::clear(iVar6 + (int)local_1a8[-3]);
                  }
                  else {
                    sVar12 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_1a8,pcVar11,sVar12);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,", size = ",9);
                  std::ostream::operator<<((ostringstream *)&local_1a8,pUVar5[uVar8].size);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,", row major = ",0xe);
                  pcVar11 = "false";
                  if ((ulong)pUVar5[uVar8].isRowMajor != 0) {
                    pcVar11 = "true";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,pcVar11,(ulong)pUVar5[uVar8].isRowMajor ^ 5);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  goto LAB_018498dd;
                }
              }
              piVar14 = piVar14 + 1;
            } while (piVar14 !=
                     *(pointer *)
                      ((long)&(local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8
                      ));
          }
        }
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != local_1d0);
  }
  return bVar15;
}

Assistant:

bool UniformBlockCase::compareSharedBlocks (const UniformLayout& refLayout, const UniformLayout& cmpLayout) const
{
	TestLog&	log			= m_testCtx.getLog();
	bool		isOk		= true;
	int			numBlocks	= m_interface.getNumUniformBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const UniformBlock&		block			= m_interface.getUniformBlock(blockNdx);
		bool					isArray			= block.isArray();
		std::string				instanceName	= string(block.getBlockName()) + (isArray ? "[0]" : "");
		int						refBlockNdx		= refLayout.getBlockIndex(instanceName.c_str());
		int						cmpBlockNdx		= cmpLayout.getBlockIndex(instanceName.c_str());
		bool					isUsed			= (block.getFlags() & (DECLARE_VERTEX|DECLARE_FRAGMENT)) != 0;

		if ((block.getFlags() & LAYOUT_SHARED) == 0)
			continue; // Not shared layout.

		DE_ASSERT(refBlockNdx >= 0);

		if (cmpBlockNdx < 0)
		{
			// Not found, should it?
			if (isUsed)
			{
				log << TestLog::Message << "Error: Uniform block '" << instanceName << "' not found" << TestLog::EndMessage;
				isOk = false;
			}

			continue; // Skip block.
		}

		const BlockLayoutEntry&		refBlockLayout	= refLayout.blocks[refBlockNdx];
		const BlockLayoutEntry&		cmpBlockLayout	= cmpLayout.blocks[cmpBlockNdx];

		if (refBlockLayout.activeUniformIndices.size() != cmpBlockLayout.activeUniformIndices.size())
		{
			log << TestLog::Message << "Error: Number of active uniforms differ in block '" << instanceName
				<< "' (expected " << refBlockLayout.activeUniformIndices.size()
				<< ", got " << cmpBlockLayout.activeUniformIndices.size()
				<< ")" << TestLog::EndMessage;
			isOk = false;
		}

		for (vector<int>::const_iterator ndxIter = refBlockLayout.activeUniformIndices.begin(); ndxIter != refBlockLayout.activeUniformIndices.end(); ndxIter++)
		{
			const UniformLayoutEntry&	refEntry	= refLayout.uniforms[*ndxIter];
			int							cmpEntryNdx	= cmpLayout.getUniformIndex(refEntry.name.c_str());

			if (cmpEntryNdx < 0)
			{
				log << TestLog::Message << "Error: Uniform '" << refEntry.name << "' not found" << TestLog::EndMessage;
				isOk = false;
				continue;
			}

			const UniformLayoutEntry&	cmpEntry	= cmpLayout.uniforms[cmpEntryNdx];

			if (refEntry.type		!= cmpEntry.type	||
				refEntry.size		!= cmpEntry.size	||
				refEntry.isRowMajor	!= cmpEntry.isRowMajor)
			{
				log << TestLog::Message << "Error: Layout mismatch in '" << refEntry.name << "':\n"
					<< "  expected: type = " << glu::getDataTypeName(refEntry.type) << ", size = " << refEntry.size << ", row major = " << (refEntry.isRowMajor ? "true" : "false") << "\n"
					<< "  got: type = " << glu::getDataTypeName(cmpEntry.type) << ", size = " << cmpEntry.size << ", row major = " << (cmpEntry.isRowMajor ? "true" : "false")
					<< TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}